

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorConstrainedPOMDP.cpp
# Opt level: O0

AlphaVector * __thiscall
AlphaVectorConstrainedPOMDP::BeliefBackup
          (AlphaVectorConstrainedPOMDP *this,JointBeliefInterface *b,Index a,GaoVectorSet *G)

{
  size_t sVar1;
  reference pvVar2;
  TimedAlgorithm *this_00;
  Index in_ECX;
  long *in_RSI;
  AlphaVector *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int s_2;
  int s_1;
  GaoVectorSetIndex o;
  int s;
  vector<double,_std::allocator<double>_> Gab;
  int maximizingVectorI;
  VectorSet *VS;
  int nrS;
  int nrO;
  AlphaVector *newVector;
  Index in_stack_fffffffffffffe78;
  Index in_stack_fffffffffffffe7c;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffe80;
  double in_stack_fffffffffffffe88;
  AlphaVector *in_stack_fffffffffffffe90;
  reference in_stack_fffffffffffffe98;
  AlphaVector *in_stack_fffffffffffffea0;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  const_reference in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffec8;
  allocator<char> local_f1;
  string local_f0 [36];
  int local_cc;
  undefined1 local_c5;
  int local_c4;
  long local_a0;
  int local_98;
  vector<double,_std::allocator<double>_> local_90;
  allocator<char> local_61;
  string local_60 [36];
  int local_3c;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_38;
  int local_30;
  int local_2c;
  Index local_1c;
  
  local_1c = in_ECX;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  sVar1 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x923cdf);
  local_2c = (int)sVar1;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  sVar1 = PlanningUnitMADPDiscrete::GetNrStates
                    (&in_stack_fffffffffffffe80->super_PlanningUnitMADPDiscrete);
  local_30 = (int)sVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffffe80,
             (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<double>::allocator((allocator<double> *)0x923da6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
             (size_type)in_stack_fffffffffffffe98,(allocator_type *)in_stack_fffffffffffffe90);
  std::allocator<double>::~allocator((allocator<double> *)0x923dcc);
  for (local_98 = 0; local_98 != local_30; local_98 = local_98 + 1) {
    in_stack_fffffffffffffec8 =
         AlphaVectorPlanning::GetPU
                   ((AlphaVectorPlanning *)
                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffec0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         PlanningUnitDecPOMDPDiscrete::GetReward
                   (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_98);
    *pvVar2 = (value_type)in_stack_fffffffffffffec0;
  }
  for (local_a0 = 0; local_a0 != local_2c; local_a0 = local_a0 + 1) {
    boost::
    multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
    ::operator[]((multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  *)in_stack_fffffffffffffec8,(index)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffeb8 =
         boost::detail::multi_array::
         const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
         ::operator[]((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                       *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (index)in_stack_fffffffffffffea8);
    local_38 = *in_stack_fffffffffffffeb8;
    boost::detail::multi_array::
    const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
    ::~const_sub_array((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                        *)0x923f61);
    in_stack_fffffffffffffeb4 =
         BeliefValue::GetMaximizingVectorIndex
                   ((BeliefInterface *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                    ,(VectorSet *)in_stack_fffffffffffffea8);
    local_3c = in_stack_fffffffffffffeb4;
    for (local_c4 = 0; local_c4 != local_30; local_c4 = local_c4 + 1) {
      in_stack_fffffffffffffea8 =
           AlphaVectorPlanning::GetPU
                     ((AlphaVectorPlanning *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffea0 =
           (AlphaVector *)
           PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x923fd8);
      in_stack_fffffffffffffe98 =
           boost::numeric::ublas::
           matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                         *)in_stack_fffffffffffffe80,
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x923ffd);
      in_stack_fffffffffffffe90 = (AlphaVector *)*in_stack_fffffffffffffe98;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_c4);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_stack_fffffffffffffe90;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = in_stack_fffffffffffffea0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *pvVar2;
      auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
      *pvVar2 = auVar3._0_8_;
    }
  }
  local_c5 = 0;
  AlphaVector::AlphaVector(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  AlphaVector::SetAction(in_RDI,local_1c);
  for (local_cc = 0; local_cc != local_30; local_cc = local_cc + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_cc);
    AlphaVector::SetValue
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (Index)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  }
  this_00 = (TimedAlgorithm *)((long)in_RSI + *(long *)(*in_RSI + -0x18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  TimedAlgorithm::StopTimer
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_c5 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
  return in_RDI;
}

Assistant:

AlphaVector AlphaVectorConstrainedPOMDP::BeliefBackup(const JointBeliefInterface &b,
                                                      Index a,
                                                      const GaoVectorSet &G) const
{
    int nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates();
    VectorSet *VS;
    // stores the index of the vector that maximizes b's value
    int maximizingVectorI;

    StartTimer("BeliefBackupPOMDP");

    vector<double> Gab(nrS);

    // initialize Gab vector with the immediate reward
    for(int s=0;s!=nrS;s++)
        Gab[s]=GetPU()->GetReward(s,a);
    
    for(GaoVectorSetIndex o=0;o!=nrO;o++)
    {
        VS=G[a][o];
        maximizingVectorI=BeliefValue::GetMaximizingVectorIndex(b,*VS);
        
        // add discounted maximizing vector (3.16)
        for(int s=0;s!=nrS;s++)
            Gab[s]+=GetPU()->GetDiscount()*
                (*VS)(maximizingVectorI,s);
    }

    // create the vector for b
    AlphaVector newVector(nrS);
    newVector.SetAction(a);
    for(int s=0;s!=nrS;s++)
        newVector.SetValue(Gab[s],s);

    StopTimer("BeliefBackupPOMDP");

    return(newVector);
}